

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::DefaultRsCaseItemSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,DefaultRsCaseItemSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  RsProdItemSyntax *node;
  size_t index_local;
  DefaultRsCaseItemSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->defaultKeyword).kind;
    token._2_1_ = (this->defaultKeyword).field_0x2;
    token.numFlags.raw = (this->defaultKeyword).numFlags.raw;
    token.rawLen = (this->defaultKeyword).rawLen;
    token.info = (this->defaultKeyword).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    token_00.kind = (this->colon).kind;
    token_00._2_1_ = (this->colon).field_0x2;
    token_00.numFlags.raw = (this->colon).numFlags.raw;
    token_00.rawLen = (this->colon).rawLen;
    token_00.info = (this->colon).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 2:
    node = not_null<slang::syntax::RsProdItemSyntax_*>::get(&this->item);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(SyntaxNode *)node);
    break;
  case 3:
    token_01.kind = (this->semi).kind;
    token_01._2_1_ = (this->semi).field_0x2;
    token_01.numFlags.raw = (this->semi).numFlags.raw;
    token_01.rawLen = (this->semi).rawLen;
    token_01.info = (this->semi).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax DefaultRsCaseItemSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return defaultKeyword;
        case 1: return colon;
        case 2: return item.get();
        case 3: return semi;
        default: return nullptr;
    }
}